

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_SwapBetweenArenasWithAllFieldsSet_Test::TestBody
          (ArenaTest_SwapBetweenArenasWithAllFieldsSet_Test *this)

{
  TestAllTypes *other;
  TestAllTypes *message;
  ulong uVar1;
  ulong uVar2;
  char *message_00;
  string output;
  Arena arena2;
  Arena arena1;
  AssertHelper local_1a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a0;
  internal local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  string local_188;
  ThreadSafeArena local_168;
  ThreadSafeArena local_c0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c0);
  other = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_c0)
  ;
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_168);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_168);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  if (other != message) {
    uVar1 = (message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
    }
    uVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    if (uVar1 == uVar2) {
      proto2_unittest::TestAllTypes::InternalSwap(message,other);
    }
    else {
      protobuf::internal::GenericSwap((Message *)message,(Message *)other);
    }
  }
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  MessageLite::SerializeToString((MessageLite *)message,&local_188);
  local_1a8.data_._0_4_ = 0;
  local_1a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_188._M_string_length;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_198,"0","output.size()",(int *)&local_1a8,(unsigned_long *)&local_1a0);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a0);
    if (local_190 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = anon_var_dwarf_a22956 + 5;
    }
    else {
      message_00 = (local_190->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x32e,message_00);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_1a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a0._M_head_impl + 8))();
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_190,local_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,
                    CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                             local_188.field_2._M_local_buf[0]) + 1);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_168);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(other);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST(ArenaTest, SwapBetweenArenasWithAllFieldsSet) {
  Arena arena1;
  TestAllTypes* arena1_message = Arena::Create<TestAllTypes>(&arena1);
  {
    Arena arena2;
    TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
    TestUtil::SetAllFields(arena2_message);
    arena2_message->Swap(arena1_message);
    std::string output;
    arena2_message->SerializeToString(&output);
    EXPECT_EQ(0, output.size());
  }
  TestUtil::ExpectAllFieldsSet(*arena1_message);
}